

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O0

void do_sitetrack(CHAR_DATA *ch,char *argument)

{
  undefined8 uVar1;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  uint uVar2;
  MYSQL *pMVar3;
  bool bVar4;
  int iVar5;
  undefined8 uVar6;
  size_t sVar7;
  undefined8 uVar8;
  long lVar9;
  CHAR_DATA *ch_00;
  char *in_RSI;
  char *pcVar10;
  v9 *in_RDI;
  string listing;
  int results;
  int id;
  char *escape;
  char query [4608];
  char arg2 [4608];
  char arg1 [4608];
  char buf [4608];
  string query_buffer;
  BUFFER *buffer;
  MYSQL_ROW row2;
  MYSQL_ROW row;
  MYSQL_RES *res2;
  MYSQL_RES *res_set;
  MYSQL *conn2;
  MYSQL *conn;
  CHAR_DATA *in_stack_ffffffffffffb068;
  CHAR_DATA *in_stack_ffffffffffffb070;
  CHAR_DATA *in_stack_ffffffffffffb078;
  char *in_stack_ffffffffffffb080;
  undefined4 in_stack_ffffffffffffb088;
  undefined4 in_stack_ffffffffffffb08c;
  char *in_stack_ffffffffffffb098;
  char *local_4d68 [2];
  string local_4d58 [32];
  char *local_4d38;
  unsigned_long_long in_stack_ffffffffffffb2d0;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_stack_ffffffffffffb2d8;
  string_view in_stack_ffffffffffffb2e0;
  char *local_4d08 [2];
  string local_4cf8 [32];
  char *local_4cd8 [2];
  string local_4cc8 [32];
  char *local_4ca8 [2];
  string local_4c98 [32];
  char local_4c78 [16];
  int local_4c68;
  uint local_4c64;
  char *local_4c60;
  char local_4c58 [3784];
  char *in_stack_ffffffffffffc270;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]>
  local_3a58 [288];
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]>
  local_2858 [288];
  char local_1658 [4616];
  string local_450 [32];
  BUFFER *local_430;
  CHAR_DATA *local_428;
  undefined8 *local_420;
  undefined8 local_418;
  long local_410;
  MYSQL *local_408;
  MYSQL *local_400;
  char *local_3f8;
  v9 *local_3f0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]>
  *local_3e8 [2];
  undefined8 local_3d8;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_3d0;
  char *local_3c8;
  size_t local_3c0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> *local_3b8;
  char *local_3b0;
  size_t sStack_3a8;
  string *local_3a0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]>
  *local_398 [2];
  undefined8 local_388;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_380;
  char *local_378;
  size_t local_370;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> *local_368;
  char *local_360 [2];
  char (*local_350) [4608];
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]>
  *local_348 [2];
  undefined8 local_338;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_330;
  char *local_328;
  size_t local_320;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> *local_318;
  char *local_310;
  size_t sStack_308;
  string *local_300;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]>
  *local_2f8 [2];
  undefined8 local_2e8;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_2e0;
  char *local_2d8;
  size_t local_2d0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> *local_2c8;
  char *local_2c0;
  size_t sStack_2b8;
  string *local_2b0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]>
  *local_2a8 [3];
  undefined8 local_290;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_288;
  char *local_280;
  size_t local_278;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> *local_270;
  char *local_268;
  size_t sStack_260;
  string *local_258;
  char *local_250;
  char **local_248;
  char *local_240;
  char **local_238;
  char *local_230;
  char **local_228;
  char *local_220;
  char **local_218;
  char *local_210;
  char **local_208;
  char *local_200;
  char **local_1f8;
  char *local_1f0;
  char **local_1e8;
  char *local_1e0;
  char **local_1d8;
  char *local_1d0;
  char **local_1c8;
  char *local_1c0;
  char **local_1b8;
  char **local_1b0;
  char *local_1a8;
  size_t sStack_1a0;
  char **local_190;
  char *local_188;
  size_t sStack_180;
  char **local_170;
  char *local_168;
  size_t sStack_160;
  char **local_150;
  char *local_148;
  size_t sStack_140;
  char **local_130;
  char *local_128;
  size_t sStack_120;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_118;
  undefined8 *local_110;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_108;
  undefined8 local_100;
  undefined8 *local_f8;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_f0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_e8;
  undefined8 *local_e0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_d8;
  undefined8 local_d0;
  undefined8 *local_c8;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_c0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_b8;
  undefined8 *local_b0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_a8;
  undefined8 local_a0;
  undefined8 *local_98;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_90;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_88;
  undefined8 *local_80;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_78;
  undefined8 local_70;
  undefined8 *local_68;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_60;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_58;
  undefined8 *local_50;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_48;
  undefined8 local_40;
  undefined8 *local_38;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_30;
  char *local_28;
  char *local_20;
  char *local_18;
  char *local_10;
  char *local_8;
  
  local_3f8 = in_RSI;
  local_3f0 = in_RDI;
  std::__cxx11::string::string(local_450);
  local_4c68 = 0;
  bVar4 = is_npc(in_stack_ffffffffffffb068);
  if (bVar4) {
    local_4c78[0] = '\x01';
    local_4c78[1] = '\0';
    local_4c78[2] = '\0';
    local_4c78[3] = '\0';
  }
  else {
    local_400 = open_conn();
    iVar5 = strcmp(local_3f8,"");
    if (iVar5 == 0) {
      local_430 = new_buf();
      local_408 = open_conn();
      sprintf(local_4c58,"SELECT site_id, denials, site_name from sitetracker");
      mysql_query(local_400,local_4c58);
      local_410 = mysql_store_result(local_400);
      add_buf((BUFFER *)CONCAT44(in_stack_ffffffffffffb08c,in_stack_ffffffffffffb088),
              in_stack_ffffffffffffb080);
      while (local_420 = (undefined8 *)mysql_fetch_row(local_410), local_420 != (undefined8 *)0x0) {
        local_4c64 = atoi((char *)*local_420);
        sprintf(local_4c58,"SELECT site_id FROM sitecomments WHERE site_id = %d",(ulong)local_4c64);
        mysql_query(local_408,local_4c58);
        local_418 = mysql_store_result(local_408);
        uVar2 = local_4c64;
        uVar8 = local_420[1];
        uVar1 = local_420[2];
        uVar6 = mysql_affected_rows(local_408);
        sprintf(local_1658,"%4d     %-26s %-10s %ld\n\r",(ulong)uVar2,uVar1,uVar8,uVar6);
        mysql_free_result(local_418);
        add_buf((BUFFER *)CONCAT44(in_stack_ffffffffffffb08c,in_stack_ffffffffffffb088),
                in_stack_ffffffffffffb080);
      }
      add_buf((BUFFER *)CONCAT44(in_stack_ffffffffffffb08c,in_stack_ffffffffffffb088),
              in_stack_ffffffffffffb080);
      add_buf((BUFFER *)CONCAT44(in_stack_ffffffffffffb08c,in_stack_ffffffffffffb088),
              in_stack_ffffffffffffb080);
      add_buf((BUFFER *)CONCAT44(in_stack_ffffffffffffb08c,in_stack_ffffffffffffb088),
              in_stack_ffffffffffffb080);
      iVar5 = get_trust(in_stack_ffffffffffffb068);
      if (0x39 < iVar5) {
        add_buf((BUFFER *)CONCAT44(in_stack_ffffffffffffb08c,in_stack_ffffffffffffb088),
                in_stack_ffffffffffffb080);
      }
      buf_string(local_430);
      page_to_char((char *)in_stack_ffffffffffffb070,in_stack_ffffffffffffb068);
      mysql_free_result(local_410);
      mysql_close(local_400);
      mysql_close(local_408);
      free_buf((BUFFER *)0x65a06d);
      local_4c78[0] = '\x01';
      local_4c78[1] = '\0';
      local_4c78[2] = '\0';
      local_4c78[3] = '\0';
    }
    else {
      local_3f8 = one_argument((char *)in_stack_ffffffffffffb070,(char *)in_stack_ffffffffffffb068);
      local_3f8 = one_argument((char *)in_stack_ffffffffffffb070,(char *)in_stack_ffffffffffffb068);
      bVar4 = str_cmp((char *)local_2858,"add");
      if (bVar4) {
        bVar4 = str_cmp((char *)local_2858,"comment");
        if (bVar4) {
          pcVar10 = "delcomment";
          bVar4 = str_cmp((char *)local_2858,"delcomment");
          if ((bVar4) || (iVar5 = get_trust(in_stack_ffffffffffffb068), iVar5 < 0x3a)) {
            pcVar10 = "delsite";
            bVar4 = str_cmp((char *)local_2858,"delsite");
            if ((bVar4) || (iVar5 = get_trust(in_stack_ffffffffffffb068), iVar5 < 0x3a)) {
              bVar4 = is_number((char *)in_stack_ffffffffffffb068);
              if (bVar4) {
                local_430 = new_buf();
                local_218 = &local_4d38;
                local_220 = "SELECT * from sitetracker where site_id={}";
                local_1f0 = "SELECT * from sitetracker where site_id={}";
                local_4d38 = "SELECT * from sitetracker where site_id={}";
                local_1e8 = local_218;
                sVar7 = std::char_traits<char>::length((char_type *)0x65ab86);
                local_10 = local_220;
                local_350 = (char (*) [4608])&stack0xffffffffffffb2d8;
                local_360[0] = local_4d38;
                local_368 = local_2858;
                local_150 = local_360;
                local_378 = local_4d38;
                local_370 = sVar7;
                local_148 = local_378;
                sStack_140 = sVar7;
                local_398[0] = fmt::v9::
                               make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,char(&)[4608]>
                                         (local_368,(v9 *)pcVar10,local_350);
                local_80 = &local_388;
                local_88 = local_398;
                local_70 = 0xc;
                local_388 = 0xc;
                args_02.field_1.values_ = in_stack_ffffffffffffb2d8.values_;
                args_02.desc_ = sVar7;
                local_78 = local_88;
                local_68 = local_80;
                local_60 = local_88;
                local_380 = local_88;
                fmt::v9::vformat_abi_cxx11_(in_stack_ffffffffffffb2e0,args_02);
                std::__cxx11::string::operator=(local_450,(string *)&stack0xffffffffffffb2d8);
                std::__cxx11::string::~string((string *)&stack0xffffffffffffb2d8);
                pMVar3 = local_400;
                uVar8 = std::__cxx11::string::c_str();
                mysql_query(pMVar3,uVar8);
                local_410 = mysql_store_result(local_400);
                if ((local_410 == 0) || (lVar9 = mysql_affected_rows(local_400), lVar9 == 0)) {
                  send_to_char(in_stack_ffffffffffffb080,in_stack_ffffffffffffb078);
                  mysql_close(local_400);
                  local_4c78[0] = '\x01';
                  local_4c78[1] = '\0';
                  local_4c78[2] = '\0';
                  local_4c78[3] = '\0';
                  goto LAB_0065b405;
                }
                local_420 = (undefined8 *)mysql_fetch_row(local_410);
                sprintf(local_1658,"Viewing %s (id %s).\n\r",local_420[1],*local_420);
                send_to_char(in_stack_ffffffffffffb080,in_stack_ffffffffffffb078);
                sprintf(local_1658,"%s players from this site have been denied.",local_420[2]);
                send_to_char(in_stack_ffffffffffffb080,in_stack_ffffffffffffb078);
                local_408 = open_conn();
                local_208 = local_4d68;
                local_210 = "SELECT * from sitecomments where site_id={}";
                local_200 = "SELECT * from sitecomments where site_id={}";
                local_4d68[0] = "SELECT * from sitecomments where site_id={}";
                local_1f8 = local_208;
                local_3c0 = std::char_traits<char>::length((char_type *)0x65af32);
                local_8 = local_210;
                local_3a0 = local_4d58;
                local_3b0 = local_4d68[0];
                local_3b8 = local_2858;
                local_130 = &local_3b0;
                local_3c8 = local_4d68[0];
                sStack_3a8 = local_3c0;
                local_128 = local_3c8;
                sStack_120 = local_3c0;
                local_3e8[0] = fmt::v9::
                               make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,char(&)[4608]>
                                         (local_3b8,local_3f0,(char (*) [4608])local_3a0);
                local_50 = &local_3d8;
                local_58 = local_3e8;
                local_40 = 0xc;
                local_3d8 = 0xc;
                args_03.field_1.values_ = in_stack_ffffffffffffb2d8.values_;
                args_03.desc_ = sVar7;
                local_48 = local_58;
                local_38 = local_50;
                local_30 = local_58;
                local_3d0 = local_58;
                fmt::v9::vformat_abi_cxx11_(in_stack_ffffffffffffb2e0,args_03);
                std::__cxx11::string::operator=(local_450,local_4d58);
                std::__cxx11::string::~string(local_4d58);
                pMVar3 = local_408;
                uVar8 = std::__cxx11::string::c_str();
                mysql_query(pMVar3,uVar8);
                local_418 = mysql_store_result(local_408);
                local_1658[0] = '\r';
                while (local_428 = (CHAR_DATA *)mysql_fetch_row(local_418),
                      local_428 != (CHAR_DATA *)0x0) {
                  sprintf(local_1658,"Added by %s on %s (CID #%s):\n\r%s",local_428->master,
                          local_428->leader,local_428->next_in_room,local_428->fighting);
                  add_buf((BUFFER *)CONCAT44(in_stack_ffffffffffffb08c,in_stack_ffffffffffffb088),
                          in_stack_ffffffffffffb080);
                }
                if (local_1658[0] == '\r') {
                  add_buf((BUFFER *)CONCAT44(in_stack_ffffffffffffb08c,in_stack_ffffffffffffb088),
                          in_stack_ffffffffffffb080);
                }
                iVar5 = get_trust(in_stack_ffffffffffffb068);
                if (0x37 < iVar5) {
                  add_buf((BUFFER *)CONCAT44(iVar5,in_stack_ffffffffffffb088),
                          in_stack_ffffffffffffb080);
                  mysql_free_result(local_418);
                  pcVar10 = local_4c58;
                  sprintf(pcVar10,"SELECT DISTINCT name FROM logins WHERE site RLIKE \'%s\'",
                          local_420[1]);
                  mysql_query(local_408,pcVar10);
                  local_418 = mysql_store_result(local_408);
                  local_1658[0] = '\0';
                  while (in_stack_ffffffffffffb070 = (CHAR_DATA *)mysql_fetch_row(local_418),
                        local_428 = in_stack_ffffffffffffb070,
                        in_stack_ffffffffffffb070 != (CHAR_DATA *)0x0) {
                    sprintf(local_4c58,"%-12s",in_stack_ffffffffffffb070->next);
                    strcat(local_1658,local_4c58);
                    local_4c68 = local_4c68 + 1;
                    if (local_4c68 % 5 == 0) {
                      strcat(local_1658,"\n\r");
                    }
                    else {
                      strcat(local_1658," ");
                    }
                  }
                  if ((local_4c68 != 0) && (local_4c68 % 5 != 0)) {
                    strcat(local_1658,"\n\r");
                  }
                  if (local_4c68 == 0) {
                    sprintf(local_1658,"(No players)\n\r");
                  }
                  add_buf((BUFFER *)CONCAT44(iVar5,in_stack_ffffffffffffb088),pcVar10);
                }
                ch_00 = (CHAR_DATA *)buf_string(local_430);
                page_to_char((char *)in_stack_ffffffffffffb070,ch_00);
                mysql_free_result(local_410);
                mysql_free_result(local_418);
                mysql_close(local_400);
                mysql_close(local_408);
                free_buf((BUFFER *)0x65b3f6);
              }
              local_4c78[0] = '\0';
              local_4c78[1] = '\0';
              local_4c78[2] = '\0';
              local_4c78[3] = '\0';
            }
            else {
              local_228 = local_4d08;
              local_230 = "DELETE FROM sitetracker WHERE site_id={}";
              local_1e0 = "DELETE FROM sitetracker WHERE site_id={}";
              local_4d08[0] = "DELETE FROM sitetracker WHERE site_id={}";
              local_1d8 = local_228;
              local_320 = std::char_traits<char>::length((char_type *)0x65a8bd);
              local_18 = local_230;
              local_300 = local_4cf8;
              local_310 = local_4d08[0];
              local_318 = local_3a58;
              local_170 = &local_310;
              local_328 = local_4d08[0];
              sStack_308 = local_320;
              local_168 = local_328;
              sStack_160 = local_320;
              local_348[0] = fmt::v9::
                             make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,char(&)[4608]>
                                       (local_318,(v9 *)pcVar10,(char (*) [4608])local_300);
              local_b0 = &local_338;
              local_b8 = local_348;
              local_a0 = 0xc;
              local_338 = 0xc;
              args_01.field_1.values_ = in_stack_ffffffffffffb2d8.values_;
              args_01.desc_ = in_stack_ffffffffffffb2d0;
              local_a8 = local_b8;
              local_98 = local_b0;
              local_90 = local_b8;
              local_330 = local_b8;
              fmt::v9::vformat_abi_cxx11_(in_stack_ffffffffffffb2e0,args_01);
              std::__cxx11::string::operator=(local_450,local_4cf8);
              std::__cxx11::string::~string(local_4cf8);
              std::__cxx11::string::data();
              one_query((char *)in_stack_ffffffffffffb070);
              mysql_close(local_400);
              send_to_char(in_stack_ffffffffffffb080,in_stack_ffffffffffffb078);
              local_4c78[0] = '\x01';
              local_4c78[1] = '\0';
              local_4c78[2] = '\0';
              local_4c78[3] = '\0';
            }
          }
          else {
            local_238 = local_4cd8;
            local_240 = "DELETE FROM sitecomments WHERE comment_id={}";
            local_1d0 = "DELETE FROM sitecomments WHERE comment_id={}";
            local_4cd8[0] = "DELETE FROM sitecomments WHERE comment_id={}";
            local_1c8 = local_238;
            local_2d0 = std::char_traits<char>::length((char_type *)0x65a5e5);
            local_20 = local_240;
            local_2b0 = local_4cc8;
            local_2c0 = local_4cd8[0];
            local_2c8 = local_3a58;
            local_190 = &local_2c0;
            local_2d8 = local_4cd8[0];
            sStack_2b8 = local_2d0;
            local_188 = local_2d8;
            sStack_180 = local_2d0;
            local_2f8[0] = fmt::v9::
                           make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,char(&)[4608]>
                                     (local_2c8,(v9 *)pcVar10,(char (*) [4608])local_2b0);
            local_e0 = &local_2e8;
            local_e8 = local_2f8;
            local_d0 = 0xc;
            local_2e8 = 0xc;
            args_00.field_1.values_ = in_stack_ffffffffffffb2d8.values_;
            args_00.desc_ = in_stack_ffffffffffffb2d0;
            local_d8 = local_e8;
            local_c8 = local_e0;
            local_c0 = local_e8;
            local_2e0 = local_e8;
            fmt::v9::vformat_abi_cxx11_(in_stack_ffffffffffffb2e0,args_00);
            std::__cxx11::string::operator=(local_450,local_4cc8);
            std::__cxx11::string::~string(local_4cc8);
            std::__cxx11::string::data();
            one_query((char *)in_stack_ffffffffffffb070);
            mysql_close(local_400);
            send_to_char(in_stack_ffffffffffffb080,in_stack_ffffffffffffb078);
            local_4c78[0] = '\x01';
            local_4c78[1] = '\0';
            local_4c78[2] = '\0';
            local_4c78[3] = '\0';
          }
        }
        else {
          iVar5 = strcmp((char *)local_3a58,"");
          if ((iVar5 == 0) || (bVar4 = is_number((char *)in_stack_ffffffffffffb068), !bVar4)) {
            local_4c78[0] = '\x01';
            local_4c78[1] = '\0';
            local_4c78[2] = '\0';
            local_4c78[3] = '\0';
          }
          else {
            pcVar10 = palloc_string(in_stack_ffffffffffffb098);
            *(char **)(*(long *)(local_3f0 + 0xc0) + 3000) = pcVar10;
            iVar5 = atoi((char *)local_3a58);
            *(short *)(*(long *)(local_3f0 + 0xc0) + 0xb0a) = (short)iVar5;
            enter_text(in_stack_ffffffffffffb070,(DO_FUN *)in_stack_ffffffffffffb068);
            mysql_close(local_400);
            local_4c78[0] = '\x01';
            local_4c78[1] = '\0';
            local_4c78[2] = '\0';
            local_4c78[3] = '\0';
          }
        }
      }
      else {
        iVar5 = strcmp((char *)local_3a58,"");
        if (iVar5 == 0) {
          send_to_char(in_stack_ffffffffffffb080,in_stack_ffffffffffffb078);
          local_4c78[0] = '\x01';
          local_4c78[1] = '\0';
          local_4c78[2] = '\0';
          local_4c78[3] = '\0';
        }
        else {
          local_4c60 = escape_string(in_stack_ffffffffffffc270);
          pcVar10 = "INSERT INTO sitetracker VALUES(nullptr, \'%s\',0)";
          sprintf(local_4c58,"INSERT INTO sitetracker VALUES(nullptr, \'%s\',0)",local_4c60);
          one_query((char *)in_stack_ffffffffffffb070);
          local_248 = local_4ca8;
          local_250 = 
          "A new site ({}) was added to the IP listings.  You should add a comment now explaining why it was added.\n\r"
          ;
          local_1c0 = 
          "A new site ({}) was added to the IP listings.  You should add a comment now explaining why it was added.\n\r"
          ;
          local_4ca8[0] =
               "A new site ({}) was added to the IP listings.  You should add a comment now explaining why it was added.\n\r"
          ;
          local_1b8 = local_248;
          local_278 = std::char_traits<char>::length((char_type *)0x65a211);
          local_28 = local_250;
          local_258 = local_4c98;
          local_268 = local_4ca8[0];
          local_270 = local_3a58;
          local_1b0 = &local_268;
          local_280 = local_4ca8[0];
          sStack_260 = local_278;
          local_1a8 = local_280;
          sStack_1a0 = local_278;
          local_2a8[0] = fmt::v9::
                         make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,char(&)[4608]>
                                   (local_270,(v9 *)pcVar10,(char (*) [4608])local_258);
          local_110 = &local_290;
          local_118 = local_2a8;
          local_100 = 0xc;
          local_290 = 0xc;
          args.field_1.values_ = in_stack_ffffffffffffb2d8.values_;
          args.desc_ = in_stack_ffffffffffffb2d0;
          local_108 = local_118;
          local_f8 = local_110;
          local_f0 = local_118;
          local_288 = local_118;
          fmt::v9::vformat_abi_cxx11_(in_stack_ffffffffffffb2e0,args);
          mysql_close(local_400);
          std::__cxx11::string::c_str();
          send_to_char(in_stack_ffffffffffffb080,in_stack_ffffffffffffb078);
          local_4c78[0] = '\x01';
          local_4c78[1] = '\0';
          local_4c78[2] = '\0';
          local_4c78[3] = '\0';
          std::__cxx11::string::~string(local_4c98);
        }
      }
    }
  }
LAB_0065b405:
  std::__cxx11::string::~string(local_450);
  return;
}

Assistant:

void do_sitetrack(CHAR_DATA *ch, char *argument)
{
	MYSQL *conn, *conn2;
	MYSQL_RES *res_set, *res2;
	MYSQL_ROW row, row2;
	BUFFER *buffer;
	std::string query_buffer;
	char buf[MSL], arg1[MSL], arg2[MSL], query[MSL];
	char *escape;
	int id, results = 0;

	if (is_npc(ch))
		return;

	conn = open_conn();

	if (!strcmp(argument, ""))
	{
		buffer = new_buf();
		conn2 = open_conn();

		sprintf(query, "SELECT site_id, denials, site_name from sitetracker");
		mysql_query(conn, query);

		res_set = mysql_store_result(conn);

		add_buf(buffer, "ID #     Site                       Denials    Comments\n\r");

		while ((row = mysql_fetch_row(res_set)) != nullptr)
		{
			id = atoi(row[0]);

			sprintf(query, "SELECT site_id FROM sitecomments WHERE site_id = %d", id);
			mysql_query(conn2, query);

			res2 = mysql_store_result(conn2);
			sprintf(buf, "%4d     %-26s %-10s %ld\n\r", id, row[2], row[1], (long)mysql_affected_rows(conn2));
			mysql_free_result(res2);
			add_buf(buffer, buf);
		}

		add_buf(buffer, "Use sitetrack <id> to view more details.\n\r");
		add_buf(buffer, "Use sitetrack comment <id> to enter a comment on the given site.\n\r");
		add_buf(buffer, "Use sitetrack add <site IP, i.e. aol.com>.  Use numeric IP ONLY if it's unresolvable.\n\r");

		if (get_trust(ch) >= 58)
			add_buf(buffer, "Use sitetrack delcomment <comment id> to delete a comment, and sitetrack delsite <site id> to delete a site.\n\r");

		page_to_char(buf_string(buffer), ch);
		mysql_free_result(res_set);

		mysql_close(conn);
		mysql_close(conn2);
		free_buf(buffer);
		return;
	}

	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);

	if (!str_cmp(arg1, "add"))
	{
		if (!strcmp(arg2, ""))
		{
			send_to_char("You must specify the site you wish to add.\n\r", ch);
			return;
		}

		escape = escape_string(arg2);
		sprintf(query, "INSERT INTO sitetracker VALUES(nullptr, '%s',0)", escape);
		one_query(query);

		auto listing = fmt::format("A new site ({}) was added to the IP listings.  You should add a comment now explaining why it was added.\n\r", arg2);

		mysql_close(conn);
		send_to_char(listing.c_str(), ch);
		return;
	}

	if (!str_cmp(arg1, "comment"))
	{
		if (!strcmp(arg2, "") || !is_number(arg2))
			return;

		ch->pcdata->entered_text = palloc_string("");
		ch->pcdata->helpid = atoi(arg2);
		enter_text(ch, comment_end_fun);

		mysql_close(conn);
		return;
	}

	if (!str_cmp(arg1, "delcomment") && get_trust(ch) >= 58)
	{
		query_buffer = fmt::format("DELETE FROM sitecomments WHERE comment_id={}", arg2);
		one_query(query_buffer.data());

		mysql_close(conn);
		send_to_char("Ok.\n\r", ch);
		return;
	}

	if (!str_cmp(arg1, "delsite") && get_trust(ch) >= 58)
	{
		query_buffer = fmt::format("DELETE FROM sitetracker WHERE site_id={}", arg2);
		one_query(query_buffer.data());

		mysql_close(conn);
		send_to_char("Ok.\n\r", ch);
		return;
	}

	if (is_number(arg1))
	{
		buffer = new_buf();
		query_buffer = fmt::format("SELECT * from sitetracker where site_id={}", arg1);
		mysql_query(conn, query_buffer.c_str());

		res_set = mysql_store_result(conn);

		if (!res_set || mysql_affected_rows(conn) < 1)
		{
			send_to_char("Invalid ID number.\n\r", ch);
			mysql_close(conn);
			return;
		}

		row = mysql_fetch_row(res_set);
		sprintf(buf, "Viewing %s (id %s).\n\r", row[1], row[0]);
		send_to_char(buf, ch);

		sprintf(buf, "%s players from this site have been denied.", row[2]);
		send_to_char("Comments:\n\r", ch);

		conn2 = open_conn();
		query_buffer = fmt::format("SELECT * from sitecomments where site_id={}", arg1);
		mysql_query(conn2, query_buffer.c_str());

		res2 = mysql_store_result(conn2);
		buf[0] = '\r';

		while ((row2 = mysql_fetch_row(res2)))
		{
			sprintf(buf, "Added by %s on %s (CID #%s):\n\r%s", row2[2], row2[3], row2[1], row2[4]);
			add_buf(buffer, buf);
		}

		if (buf[0] == '\r')
			add_buf(buffer, "(No comments)\n\r");

		if (get_trust(ch) >= 56)
		{
			add_buf(buffer, "Players from site:\n\r");

			mysql_free_result(res2);

			sprintf(query, "SELECT DISTINCT name FROM logins WHERE site RLIKE '%s'", row[1]);
			mysql_query(conn2, query);

			res2 = mysql_store_result(conn2);
			buf[0] = '\0';

			while ((row2 = mysql_fetch_row(res2)))
			{
				sprintf(query, "%-12s", row2[0]);
				strcat(buf, query);

				if (++results % 5 == 0)
					strcat(buf, "\n\r");
				else
					strcat(buf, " ");
			}

			if (results && results % 5)
				strcat(buf, "\n\r");
			if (!results)
				sprintf(buf, "(No players)\n\r");

			add_buf(buffer, buf);
		}

		page_to_char(buf_string(buffer), ch);
		mysql_free_result(res_set);
		mysql_free_result(res2);

		mysql_close(conn);
		mysql_close(conn2);
		free_buf(buffer);
	}
}